

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

void __thiscall
cmServerProtocol1::GeneratorInformation::SetupGenerator
          (GeneratorInformation *this,cmake *cm,string *errorMessage)

{
  cmGlobalGenerator *gg;
  long *plVar1;
  long *plVar2;
  string fullGeneratorName;
  long *local_f0;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  cmExternalMakefileProjectGenerator::CreateFullGeneratorName
            (&local_50,&this->GeneratorName,&this->ExtraGeneratorName);
  cmake::SetHomeDirectory(cm,&this->SourceDirectory);
  cmake::SetHomeOutputDirectory(cm,&this->BuildDirectory);
  gg = cmake::CreateGlobalGenerator(cm,&local_50);
  if (gg == (cmGlobalGenerator *)0x0) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Could not set up the requested combination of \"","");
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)kGENERATOR_KEY_abi_cxx11_._M_dataplus._M_p);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_c0 = *plVar2;
      lStack_b8 = plVar1[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar2;
      local_d0 = (long *)*plVar1;
    }
    local_c8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_a0 = *plVar2;
      lStack_98 = plVar1[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar2;
      local_b0 = (long *)*plVar1;
    }
    local_a8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,
                                (ulong)kEXTRA_GENERATOR_KEY_abi_cxx11_._M_dataplus._M_p);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar2;
      local_90 = (long *)*plVar1;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_e0 = *plVar2;
      lStack_d8 = plVar1[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar2;
      local_f0 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (errorMessage != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)errorMessage);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  else {
    cmake::SetGlobalGenerator(cm,gg);
    std::__cxx11::string::_M_assign((string *)&cm->GeneratorToolset);
    std::__cxx11::string::_M_assign((string *)&cm->GeneratorPlatform);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmServerProtocol1::GeneratorInformation::SetupGenerator(
  cmake* cm, std::string* errorMessage)
{
  const std::string fullGeneratorName =
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
      GeneratorName, ExtraGeneratorName);

  cm->SetHomeDirectory(SourceDirectory);
  cm->SetHomeOutputDirectory(BuildDirectory);

  cmGlobalGenerator* gg = cm->CreateGlobalGenerator(fullGeneratorName);
  if (!gg) {
    setErrorMessage(
      errorMessage,
      std::string("Could not set up the requested combination of \"") +
        kGENERATOR_KEY + "\" and \"" + kEXTRA_GENERATOR_KEY + "\"");
    return;
  }

  cm->SetGlobalGenerator(gg);

  cm->SetGeneratorToolset(Toolset);
  cm->SetGeneratorPlatform(Platform);
}